

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

int __thiscall cmCTest::ProcessSteps(cmCTest *this)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  unsigned_long uVar4;
  char *__rhs;
  ostream *poVar5;
  uint uVar6;
  byte bVar7;
  _Head_base<0UL,_cmCTest::Private_*,_false> _Var8;
  cmCTestGenericHandler *this_00;
  ulong dindex;
  bool bVar9;
  cmDuration cVar10;
  allocator<char> local_1f9;
  Directory d;
  string fullname;
  string local_1c8;
  string notes_dir;
  
  _Var8._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  bVar7 = 1;
  for (lVar3 = 0x1f68; ((bVar7 & 1) != 0 && (lVar3 != 0x2268)); lVar3 = lVar3 + 0x40) {
    bVar7 = *(byte *)((long)&(_Var8._M_head_impl)->RepeatTests + lVar3) ^ 1;
  }
  bVar9 = false;
  uVar6 = 0;
  if ((_Var8._M_head_impl)->Parts[1].Enabled != false) {
    cVar10 = GetRemainingTimeAllowed(this);
    bVar9 = false;
    _Var8._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    if (cVar10.__r <= 120.0) {
      uVar6 = 0;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&notes_dir,"SourceDirectory",(allocator<char> *)&d);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c8,"SourceDirectory",&local_1f9);
      GetCTestConfiguration(&fullname,this,&local_1c8);
      this_00 = &((_Var8._M_head_impl)->UpdateHandler).super_cmCTestGenericHandler;
      cmCTestGenericHandler::SetPersistentOption(this_00,&notes_dir,fullname._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&fullname);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&notes_dir);
      uVar1 = (*this_00->_vptr_cmCTestGenericHandler[1])(this_00);
      uVar6 = uVar1 >> 0x1f;
      bVar9 = uVar1 != 0;
      _Var8._M_head_impl =
           (this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    }
  }
  if ((!bVar9) && ((_Var8._M_head_impl)->TestModel == 2)) {
    return 0;
  }
  if ((_Var8._M_head_impl)->Parts[2].Enabled == true) {
    cVar10 = GetRemainingTimeAllowed(this);
    _Var8._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    if (120.0 < cVar10.__r) {
      iVar2 = (*((_Var8._M_head_impl)->ConfigureHandler).super_cmCTestGenericHandler.
                _vptr_cmCTestGenericHandler[1])(&(_Var8._M_head_impl)->ConfigureHandler);
      uVar6 = uVar6 + (iVar2 >> 0x1f) * -2;
      _Var8._M_head_impl =
           (this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    }
  }
  if (((_Var8._M_head_impl)->Parts[3].Enabled == true) &&
     (cVar10 = GetRemainingTimeAllowed(this), 120.0 < cVar10.__r)) {
    UpdateCTestConfiguration(this);
    _Var8._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    iVar2 = (**(code **)(*(long *)&((_Var8._M_head_impl)->BuildHandler).super_cmCTestGenericHandler
                        + 8))(&(_Var8._M_head_impl)->BuildHandler);
    uVar6 = uVar6 + (iVar2 >> 0x1f) * -4;
  }
  if ((((((this->Impl)._M_t.
          super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
          super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
          super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->Parts[4].Enabled | bVar7)
       & 1) != 0) && (cVar10 = GetRemainingTimeAllowed(this), 120.0 < cVar10.__r)) {
    UpdateCTestConfiguration(this);
    _Var8._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    iVar2 = (**(code **)(*(long *)&((_Var8._M_head_impl)->TestHandler).super_cmCTestGenericHandler +
                        8))(&(_Var8._M_head_impl)->TestHandler);
    uVar6 = uVar6 + (iVar2 >> 0x1f) * -8;
  }
  if ((((this->Impl)._M_t.
        super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
        super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
        super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->Parts[5].Enabled == true) &&
     (cVar10 = GetRemainingTimeAllowed(this), 120.0 < cVar10.__r)) {
    UpdateCTestConfiguration(this);
    _Var8._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    uVar1 = (**(code **)(*(long *)&((_Var8._M_head_impl)->CoverageHandler).
                                   super_cmCTestGenericHandler + 8))
                      (&(_Var8._M_head_impl)->CoverageHandler);
    uVar6 = (uVar1 >> 0x1a & 0xffffffe0) + uVar6;
  }
  if ((((this->Impl)._M_t.
        super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
        super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
        super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->Parts[6].Enabled == true) &&
     (cVar10 = GetRemainingTimeAllowed(this), 120.0 < cVar10.__r)) {
    UpdateCTestConfiguration(this);
    _Var8._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    uVar1 = (**(code **)(*(long *)&((_Var8._M_head_impl)->MemCheckHandler).super_cmCTestTestHandler
                        + 8))(&(_Var8._M_head_impl)->MemCheckHandler);
    uVar6 = uVar1 >> 0x1b & 0xfffffff0 | uVar6;
  }
  _Var8._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  if ((bVar7 & 1) == 0) {
    std::operator+(&notes_dir,&(_Var8._M_head_impl)->BinaryDir,"/Testing/Notes");
    bVar9 = cmsys::SystemTools::FileIsDirectory(&notes_dir);
    if (bVar9) {
      cmsys::Directory::Directory(&d);
      cmsys::Directory::Load(&d,&notes_dir);
      for (dindex = 0; uVar4 = cmsys::Directory::GetNumberOfFiles(&d), dindex < uVar4;
          dindex = dindex + 1) {
        __rhs = cmsys::Directory::GetFile(&d,dindex);
        std::operator+(&local_1c8,&notes_dir,"/");
        std::operator+(&fullname,&local_1c8,__rhs);
        std::__cxx11::string::~string((string *)&local_1c8);
        bVar9 = cmsys::SystemTools::FileExists(&fullname);
        if ((bVar9) && (bVar9 = cmsys::SystemTools::FileIsDirectory(&fullname), !bVar9)) {
          _Var8._M_head_impl =
               (this->Impl)._M_t.
               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
               super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
          if (((_Var8._M_head_impl)->NotesFiles)._M_string_length != 0) {
            std::__cxx11::string::append((char *)&(_Var8._M_head_impl)->NotesFiles);
            _Var8._M_head_impl =
                 (this->Impl)._M_t.
                 super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
                 super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
          }
          std::__cxx11::string::append((string *)&(_Var8._M_head_impl)->NotesFiles);
          ((this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->Parts[8].Enabled = true;
        }
        std::__cxx11::string::~string((string *)&fullname);
      }
      cmsys::Directory::~Directory(&d);
    }
    std::__cxx11::string::~string((string *)&notes_dir);
    _Var8._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  }
  if ((_Var8._M_head_impl)->Parts[8].Enabled == true) {
    UpdateCTestConfiguration(this);
    _Var8._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    if (((_Var8._M_head_impl)->NotesFiles)._M_string_length != 0) {
      GenerateNotesFile(this,((_Var8._M_head_impl)->NotesFiles)._M_dataplus._M_p);
      _Var8._M_head_impl =
           (this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    }
  }
  if ((_Var8._M_head_impl)->Parts[7].Enabled == true) {
    UpdateCTestConfiguration(this);
    _Var8._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    iVar2 = (**(code **)(*(long *)&((_Var8._M_head_impl)->SubmitHandler).super_cmCTestGenericHandler
                        + 8))(&(_Var8._M_head_impl)->SubmitHandler);
    if (iVar2 < 0) {
      uVar6 = uVar6 | 0x40;
      goto LAB_00146e50;
    }
  }
  if (uVar6 == 0) {
    return 0;
  }
LAB_00146e50:
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&notes_dir);
  poVar5 = std::operator<<((ostream *)&notes_dir,"Errors while running CTest");
  std::endl<char,std::char_traits<char>>(poVar5);
  std::__cxx11::stringbuf::str();
  Log(this,7,
      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmCTest.cxx"
      ,0x3f8,fullname._M_dataplus._M_p,false);
  std::__cxx11::string::~string((string *)&fullname);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&notes_dir);
  return uVar6;
}

Assistant:

int cmCTest::ProcessSteps()
{
  int res = 0;
  bool notest = true;
  int update_count = 0;

  for (Part p = PartStart; notest && p != PartCount; p = Part(p + 1)) {
    notest = !this->Impl->Parts[p];
  }
  if (this->Impl->Parts[PartUpdate] &&
      (this->GetRemainingTimeAllowed() > std::chrono::minutes(2))) {
    cmCTestUpdateHandler* uphandler = this->GetUpdateHandler();
    uphandler->SetPersistentOption(
      "SourceDirectory",
      this->GetCTestConfiguration("SourceDirectory").c_str());
    update_count = uphandler->ProcessHandler();
    if (update_count < 0) {
      res |= cmCTest::UPDATE_ERRORS;
    }
  }
  if (this->Impl->TestModel == cmCTest::CONTINUOUS && !update_count) {
    return 0;
  }
  if (this->Impl->Parts[PartConfigure] &&
      (this->GetRemainingTimeAllowed() > std::chrono::minutes(2))) {
    if (this->GetConfigureHandler()->ProcessHandler() < 0) {
      res |= cmCTest::CONFIGURE_ERRORS;
    }
  }
  if (this->Impl->Parts[PartBuild] &&
      (this->GetRemainingTimeAllowed() > std::chrono::minutes(2))) {
    this->UpdateCTestConfiguration();
    if (this->GetBuildHandler()->ProcessHandler() < 0) {
      res |= cmCTest::BUILD_ERRORS;
    }
  }
  if ((this->Impl->Parts[PartTest] || notest) &&
      (this->GetRemainingTimeAllowed() > std::chrono::minutes(2))) {
    this->UpdateCTestConfiguration();
    if (this->GetTestHandler()->ProcessHandler() < 0) {
      res |= cmCTest::TEST_ERRORS;
    }
  }
  if (this->Impl->Parts[PartCoverage] &&
      (this->GetRemainingTimeAllowed() > std::chrono::minutes(2))) {
    this->UpdateCTestConfiguration();
    if (this->GetCoverageHandler()->ProcessHandler() < 0) {
      res |= cmCTest::COVERAGE_ERRORS;
    }
  }
  if (this->Impl->Parts[PartMemCheck] &&
      (this->GetRemainingTimeAllowed() > std::chrono::minutes(2))) {
    this->UpdateCTestConfiguration();
    if (this->GetMemCheckHandler()->ProcessHandler() < 0) {
      res |= cmCTest::MEMORY_ERRORS;
    }
  }
  if (!notest) {
    std::string notes_dir = this->Impl->BinaryDir + "/Testing/Notes";
    if (cmSystemTools::FileIsDirectory(notes_dir)) {
      cmsys::Directory d;
      d.Load(notes_dir);
      unsigned long kk;
      for (kk = 0; kk < d.GetNumberOfFiles(); kk++) {
        const char* file = d.GetFile(kk);
        std::string fullname = notes_dir + "/" + file;
        if (cmSystemTools::FileExists(fullname) &&
            !cmSystemTools::FileIsDirectory(fullname)) {
          if (!this->Impl->NotesFiles.empty()) {
            this->Impl->NotesFiles += ";";
          }
          this->Impl->NotesFiles += fullname;
          this->Impl->Parts[PartNotes].Enable();
        }
      }
    }
  }
  if (this->Impl->Parts[PartNotes]) {
    this->UpdateCTestConfiguration();
    if (!this->Impl->NotesFiles.empty()) {
      this->GenerateNotesFile(this->Impl->NotesFiles.c_str());
    }
  }
  if (this->Impl->Parts[PartSubmit]) {
    this->UpdateCTestConfiguration();
    if (this->GetSubmitHandler()->ProcessHandler() < 0) {
      res |= cmCTest::SUBMIT_ERRORS;
    }
  }
  if (res != 0) {
    cmCTestLog(this, ERROR_MESSAGE, "Errors while running CTest" << std::endl);
  }
  return res;
}